

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

EmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitLaneIndex(WasmBytecodeGenerator *this,OpCodeAsmJs op)

{
  uint index_00;
  WasmConstLitNode cnst;
  WasmReaderBase *pWVar1;
  EmitInfo EVar2;
  undefined4 uStack_2c;
  WasmConstLitNode dummy;
  uint index;
  OpCodeAsmJs op_local;
  WasmBytecodeGenerator *this_local;
  
  pWVar1 = GetReader(this);
  index_00 = (pWVar1->m_currentNode).field_1.brTable.numTargets;
  CheckLaneIndex(this,op,index_00);
  cnst.field_0.v128[1] = uStack_2c;
  cnst.field_0.v128[0] = index_00;
  cnst.field_0._8_8_ = dummy.field_0.i64;
  EVar2 = EmitConst(this,FirstLocalType,cnst);
  return EVar2;
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitLaneIndex(Js::OpCodeAsmJs op)
{
    const uint index = GetReader()->m_currentNode.lane.index;
    CheckLaneIndex(op, index);
    WasmConstLitNode dummy;
    dummy.i32 = index;
    return EmitConst(WasmTypes::I32, dummy);
}